

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O1

void scheck_tempv(int n,float *tempv)

{
  ulong uVar1;
  
  if (0 < n) {
    uVar1 = 0;
    do {
      if ((tempv[uVar1] != 0.0) || (NAN(tempv[uVar1]))) {
        scheck_tempv_cold_1();
      }
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

void scheck_tempv(int n, float *tempv)
{
    int i;
	
    for (i = 0; i < n; i++) {
	if (tempv[i] != 0.0) 
	{
	    fprintf(stderr,"tempv[%d] = %f\n", i,tempv[i]);
	    ABORT("scheck_tempv");
	}
    }
}